

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_true>
         ::parse(char_t *s)

{
  byte *pbVar1;
  char_t *pcVar2;
  char_t *pcVar3;
  byte bVar4;
  byte *s_00;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  pbVar1 = (byte *)s;
LAB_0029ac30:
  do {
    s_00 = pbVar1;
    bVar4 = *s_00;
    if (((anonymous_namespace)::chartype_table[bVar4] & 1) != 0) goto LAB_0029ac74;
    bVar4 = s_00[1];
    if (((anonymous_namespace)::chartype_table[bVar4] & 1) != 0) {
      s_00 = s_00 + 1;
      goto LAB_0029ac74;
    }
    bVar4 = s_00[2];
    if (((anonymous_namespace)::chartype_table[bVar4] & 1) != 0) {
      s_00 = s_00 + 2;
      goto LAB_0029ac74;
    }
    bVar4 = s_00[3];
    pbVar1 = s_00 + 4;
  } while (((anonymous_namespace)::chartype_table[bVar4] & 1) == 0);
  s_00 = s_00 + 3;
LAB_0029ac74:
  if (bVar4 == 0x26) {
    pbVar1 = (byte *)strconv_escape((char_t *)s_00,&local_38);
    goto LAB_0029ac30;
  }
  if (bVar4 == 0) {
    pcVar2 = gap::flush(&local_38,(char_t *)s_00);
    goto LAB_0029accf;
  }
  if (bVar4 != 0x3c) {
    pbVar1 = s_00 + 1;
    goto LAB_0029ac30;
  }
  pcVar2 = gap::flush(&local_38,(char_t *)s_00);
  do {
    pcVar3 = pcVar2;
    if (pcVar3 <= s) break;
    pcVar2 = pcVar3 + -1;
  } while (((anonymous_namespace)::chartype_table[(byte)pcVar3[-1]] & 8) != 0);
  *pcVar3 = '\0';
  return (char_t *)(s_00 + 1);
  while (pcVar2 = pcVar3 + -1, ((anonymous_namespace)::chartype_table[(byte)pcVar3[-1]] & 8) != 0) {
LAB_0029accf:
    pcVar3 = pcVar2;
    if (pcVar3 <= s) break;
  }
  *pcVar3 = '\0';
  return (char_t *)s_00;
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}